

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_decompress.c
# Opt level: O0

size_t ZSTD_nextSrcSizeToDecompressWithInputSize(ZSTD_DCtx *dctx,size_t inputSize)

{
  ZSTD_DCtx *local_38;
  ZSTD_DCtx *local_30;
  ulong local_28;
  size_t inputSize_local;
  ZSTD_DCtx *dctx_local;
  
  if ((dctx->stage == ZSTDds_decompressBlock) || (dctx->stage == ZSTDds_decompressLastBlock)) {
    if (dctx->bType == bt_raw) {
      local_28 = inputSize;
      if (inputSize < 2) {
        local_28 = 1;
      }
      if (local_28 < dctx->expected) {
        local_30 = (ZSTD_DCtx *)inputSize;
        if (inputSize < 2) {
          local_30 = (ZSTD_DCtx *)0x1;
        }
        local_38 = local_30;
      }
      else {
        local_38 = (ZSTD_DCtx *)dctx->expected;
      }
      dctx_local = local_38;
    }
    else {
      dctx_local = (ZSTD_DCtx *)dctx->expected;
    }
  }
  else {
    dctx_local = (ZSTD_DCtx *)dctx->expected;
  }
  return (size_t)dctx_local;
}

Assistant:

static size_t ZSTD_nextSrcSizeToDecompressWithInputSize(ZSTD_DCtx* dctx, size_t inputSize) {
    if (!(dctx->stage == ZSTDds_decompressBlock || dctx->stage == ZSTDds_decompressLastBlock))
        return dctx->expected;
    if (dctx->bType != bt_raw)
        return dctx->expected;
    return MIN(MAX(inputSize, 1), dctx->expected);
}